

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O0

QVariant * __thiscall QBmpHandler::option(QBmpHandler *this,ImageOption option)

{
  short sVar1;
  long lVar2;
  bool bVar3;
  int in_EDX;
  QBmpHandler *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  Format format;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *pQVar4;
  int local_28;
  QSize *local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    if (in_RSI->state == Error) {
      ::QVariant::QVariant((QVariant *)0x285a87);
    }
    else {
      pQVar4 = in_RDI;
      if ((in_RSI->state != Ready) || (bVar3 = readHeader(in_RSI), bVar3)) {
        QSize::QSize(pQVar4,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
        ::QVariant::QVariant((QVariant *)pQVar4,local_10);
      }
      else {
        ::QVariant::QVariant((QVariant *)0x285aaf);
      }
    }
  }
  else if (in_EDX == 0xe) {
    if (in_RSI->state == Error) {
      ::QVariant::QVariant((QVariant *)0x285afd);
    }
    else {
      pQVar4 = in_RDI;
      if ((in_RSI->state != Ready) || (bVar3 = readHeader(in_RSI), bVar3)) {
        sVar1 = (in_RSI->infoHeader).biBitCount;
        if ((sVar1 == 4) || (sVar1 == 8)) {
          local_28 = 3;
        }
        else if (((sVar1 == 0x10) || (sVar1 == 0x18)) || (sVar1 == 0x20)) {
          if ((((in_RSI->infoHeader).biCompression == 3) ||
              ((in_RSI->infoHeader).biCompression == 4)) &&
             ((0x6b < (in_RSI->infoHeader).biSize && ((in_RSI->infoHeader).biAlphaMask != 0)))) {
            local_28 = 5;
          }
          else {
            local_28 = 4;
          }
        }
        else {
          local_28 = 1;
        }
        ::QVariant::QVariant((QVariant *)pQVar4,local_28);
      }
      else {
        ::QVariant::QVariant((QVariant *)0x285b25);
      }
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0x285be0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QBmpHandler::option(ImageOption option) const
{
    if (option == Size) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QBmpHandler*>(this)->readHeader())
            return QVariant();
        return QSize(infoHeader.biWidth, infoHeader.biHeight);
    } else if (option == ImageFormat) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QBmpHandler*>(this)->readHeader())
            return QVariant();
        QImage::Format format;
        switch (infoHeader.biBitCount) {
            case 32:
            case 24:
            case 16:
                if ((infoHeader.biCompression == BMP_BITFIELDS || infoHeader.biCompression == BMP_ALPHABITFIELDS) && infoHeader.biSize >= BMP_WIN4 && infoHeader.biAlphaMask)
                    format = QImage::Format_ARGB32;
                else
                    format = QImage::Format_RGB32;
                break;
            case 8:
            case 4:
                format = QImage::Format_Indexed8;
                break;
            default:
                format = QImage::Format_Mono;
            }
        return format;
    }
    return QVariant();
}